

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thinlenscamera.hpp
# Opt level: O3

void __thiscall ThinlensCamera::ThinlensCamera(ThinlensCamera *this,Json *conf)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  double dVar14;
  const_reference pvVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float ret;
  float ret_1;
  float local_30;
  float local_2c;
  undefined1 local_28 [16];
  
  Camera::Camera(&this->super_Camera,conf);
  (this->super_Camera)._vptr_Camera = (_func_int **)&PTR_sampleray_0016ad00;
  *(undefined8 *)&(this->super_Camera).field_0x3c = 0;
  *(undefined8 *)&this->field_0x44 = 0;
  (this->uphalf).y = 0.0;
  (this->uphalf).z = 0.0;
  (this->lefthalf).x = 0.0;
  (this->lefthalf).y = 0.0;
  (this->lefthalf).z = 0.0;
  pvVar15 = nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        *)conf,"focaldistance");
  nlohmann::detail::
  from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_float,_0>
            (pvVar15,&local_30);
  this->focaldistance = local_30;
  pvVar15 = nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        *)conf,"lensradius");
  nlohmann::detail::
  from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_float,_0>
            (pvVar15,&local_2c);
  this->lensradius = local_2c;
  fVar16 = (this->super_Camera).look_at.z - (this->super_Camera).position.z;
  uVar1 = (this->super_Camera).position.x;
  uVar6 = (this->super_Camera).position.y;
  uVar2 = (this->super_Camera).look_at.x;
  uVar7 = (this->super_Camera).look_at.y;
  fVar18 = (float)uVar2 - (float)uVar1;
  fVar19 = (float)uVar7 - (float)uVar6;
  fVar17 = 1.0 / SQRT(fVar16 * fVar16 + fVar18 * fVar18 + fVar19 * fVar19);
  fVar16 = fVar16 * fVar17;
  fVar18 = fVar17 * fVar18;
  fVar17 = fVar17 * fVar19;
  *(ulong *)&(this->super_Camera).field_0x3c = CONCAT44(fVar17,fVar18);
  *(float *)&this->field_0x44 = fVar16;
  uVar3 = (this->super_Camera).up.x;
  uVar8 = (this->super_Camera).up.y;
  fVar19 = (this->super_Camera).up.z * fVar18 - fVar16 * (float)uVar3;
  uVar4 = (this->super_Camera).up.y;
  uVar9 = (this->super_Camera).up.z;
  fVar22 = (float)uVar3 * fVar17 - (float)uVar4 * fVar18;
  fVar23 = (float)uVar8 * fVar16 - (float)uVar9 * fVar17;
  fVar20 = fVar17 * fVar22 - fVar19 * fVar16;
  fVar21 = fVar16 * fVar23 - fVar22 * fVar18;
  fVar22 = fVar19 * fVar18 - fVar23 * fVar17;
  fVar19 = 1.0 / SQRT(fVar22 * fVar22 + fVar20 * fVar20 + fVar21 * fVar21);
  (this->super_Camera).up.x = fVar19 * fVar20;
  (this->super_Camera).up.y = fVar19 * fVar21;
  (this->super_Camera).up.z = fVar22 * fVar19;
  iVar11 = (this->super_Camera).resy;
  iVar12 = (this->super_Camera).resx;
  dVar14 = tan((double)((this->super_Camera).fov * 0.5));
  fVar19 = (float)(dVar14 * (double)(((float)iVar11 *
                                     SQRT(fVar16 * fVar16 + fVar18 * fVar18 + fVar17 * fVar17)) /
                                    (float)iVar12));
  fVar16 = (this->super_Camera).up.x;
  fVar17 = (this->super_Camera).fov;
  fVar18 = *(float *)&(this->super_Camera).field_0x3c;
  uVar5 = (this->super_Camera).up.y;
  uVar10 = (this->super_Camera).up.z;
  (this->uphalf).x = fVar16 * fVar19;
  (this->uphalf).y = (float)uVar5 * fVar19;
  (this->uphalf).z = (float)uVar10 * fVar19;
  fVar19 = (float)*(undefined8 *)&this->field_0x40;
  fVar22 = (float)((ulong)*(undefined8 *)&this->field_0x40 >> 0x20);
  local_28 = ZEXT416((uint)(fVar16 * fVar19 - fVar18 * (float)uVar5));
  dVar14 = tan((double)(fVar17 * 0.5));
  fVar17 = (float)dVar14;
  fVar19 = fVar17 * (fVar22 * (float)uVar5 - (float)uVar10 * fVar19);
  fVar16 = fVar17 * (fVar18 * (float)uVar10 - fVar16 * fVar22);
  (this->lefthalf).x = fVar19;
  (this->lefthalf).y = fVar16;
  (this->lefthalf).z = (float)local_28._0_4_ * fVar17;
  if ((this->super_Camera).mirror == true) {
    uVar13 = CONCAT44(fVar16,fVar19) ^ 0x8000000080000000;
    (this->lefthalf).x = (float)(int)uVar13;
    (this->lefthalf).y = (float)(int)(uVar13 >> 0x20);
    (this->lefthalf).z = -((float)local_28._0_4_ * fVar17);
  }
  return;
}

Assistant:

ThinlensCamera(const Json& conf): Camera(conf) {
		focaldistance = conf["focaldistance"];
		lensradius = conf["lensradius"];
		dir = normalized(look_at - position);
		up = normalized(cross(dir, cross(up, dir)));
		uphalf = norm(dir) * resy / resx * tan(fov/2) * up;
		lefthalf = cross(up, dir) * tan(fov/2);
		if (mirror) lefthalf = -lefthalf;
	}